

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool ON_XMLNodePrivate::GetNextTag(ON_wString *tag,wchar_t **pBuffer,bool bValidateTag)

{
  int numChars_00;
  bool bVar1;
  wchar_t *pwStack_38;
  int numChars;
  wchar_t *pEnd;
  wchar_t *start;
  bool bValidateTag_local;
  wchar_t **pBuffer_local;
  ON_wString *tag_local;
  
  for (pEnd = *pBuffer; *pEnd != L'<'; pEnd = pEnd + 1) {
    if (*pEnd == L'\0') {
      return false;
    }
  }
  while (pEnd[1] == L'?') {
    while( true ) {
      bVar1 = false;
      if (*pEnd == L'?') {
        bVar1 = pEnd[1] == L'>';
      }
      if (!(bool)(bVar1 ^ 1)) break;
      if (*pEnd == L'\0') {
        return false;
      }
      pEnd = pEnd + 1;
    }
    for (; *pEnd != L'<'; pEnd = pEnd + 1) {
    }
  }
  while( true ) {
    bVar1 = false;
    if ((pEnd[1] == L'!') && (bVar1 = false, pEnd[2] == L'-')) {
      bVar1 = pEnd[3] == L'-';
    }
    if (!bVar1) break;
    while( true ) {
      bVar1 = false;
      if ((*pEnd == L'-') && (bVar1 = false, pEnd[1] == L'-')) {
        bVar1 = pEnd[2] == L'>';
      }
      if (!(bool)(bVar1 ^ 1)) break;
      if (*pEnd == L'\0') {
        return false;
      }
      pEnd = pEnd + 1;
    }
    for (; *pEnd != L'<'; pEnd = pEnd + 1) {
    }
  }
  pwStack_38 = pEnd;
  while( true ) {
    if (*pwStack_38 == L'>') {
      *pBuffer = pwStack_38 + 1;
      numChars_00 = (int)((long)pwStack_38 - (long)pEnd >> 2) + 1;
      if (numChars_00 < 2) {
        tag_local._7_1_ = false;
      }
      else {
        ON_wString::Set(tag,pEnd,numChars_00);
        if ((bValidateTag) && (bVar1 = AssertValidTag(tag), !bVar1)) {
          AttemptToFixTag(tag);
          AssertValidTag(tag);
        }
        tag_local._7_1_ = true;
      }
      return tag_local._7_1_;
    }
    if (*pwStack_38 == L'\0') break;
    pwStack_38 = pwStack_38 + 1;
  }
  return false;
}

Assistant:

bool ON_XMLNodePrivate::GetNextTag(ON_wString& tag, wchar_t*& pBuffer, bool bValidateTag) // Static.
{
  auto* start = pBuffer;
  while (*start != L'<')
  {
    if (0 == *start)
    {
      OUTPUT_DEBUG_STRING_EOL(L"Start of tag '<' not found");
      return false;
    }

    start++;
  }

  while (start[1] == L'?')
  {
    // This is a nasty document description tag - need to look for the end tag and skip it.
    while (!(start[0] == L'?' && start[1] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of document description tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  while ((start[1] == L'!') && (start[2] == L'-') && (start[3] == L'-'))
  {
    // This is a comment tag - need to look for the end tag and skip it.
    while (!(start[0] == L'-' && start[1] == L'-' && start[2] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of comment tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  wchar_t* pEnd = start;
  while (*pEnd != L'>')
  {
    if (0 == *pEnd)
    {
      OUTPUT_DEBUG_STRING_EOL(L"End of tag '>' not found");
      return false;
    }

    pEnd++;
  }

  pBuffer = pEnd + 1;

  // Copy the tag into the ready-made string.
  const auto numChars = int(pEnd - start + 1);
  if (numChars < 2)
    return false;

  tag.Set(start, numChars);

  if (bValidateTag)
  {
    if (!AssertValidTag(tag))
    {
      AttemptToFixTag(tag);
      AssertValidTag(tag);
    }
  }

  return true;
}